

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O3

BasicValue *
cvm::Native::ToString
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_48;
  shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> local_28;
  
  if ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl._M_node.
      _M_size == 1) {
    local_28.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_28.
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BasicValue::toString_abi_cxx11_
              (&local_48,
               (BasicValue *)
               ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
                _M_node.super__List_node_base._M_next + 1),&local_28);
    __return_storage_ptr__->Type = StringType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->StrVal,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_28.
        super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.
                 super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    paVar1 = &local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->Type = StringType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->StrVal,paVar1,paVar1);
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->ArrayPtr).
    super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue Native::ToString(std::list<BasicValue> &Args) {
  if (Args.size() != 1)
    return std::string();
  return Args.front().toString();
}